

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6295.c
# Opt level: O0

void okim6295_w(void *info,UINT8 offset,UINT8 data)

{
  okim6295_state *chip;
  UINT8 data_local;
  UINT8 offset_local;
  void *info_local;
  
  switch(offset) {
  case '\0':
    okim6295_write_command((okim6295_state *)info,data);
    break;
  case '\b':
    *(uint *)((long)info + 0xd8) = *(uint *)((long)info + 0xd8) & 0xffffff00;
    *(uint *)((long)info + 0xd8) = (uint)data | *(uint *)((long)info + 0xd8);
    break;
  case '\t':
    *(uint *)((long)info + 0xd8) = *(uint *)((long)info + 0xd8) & 0xffff00ff;
    *(uint *)((long)info + 0xd8) = (uint)data << 8 | *(uint *)((long)info + 0xd8);
    break;
  case '\n':
    *(uint *)((long)info + 0xd8) = *(uint *)((long)info + 0xd8) & 0xff00ffff;
    *(uint *)((long)info + 0xd8) = (uint)data << 0x10 | *(uint *)((long)info + 0xd8);
    break;
  case '\v':
    *(uint *)((long)info + 0xd8) = *(uint *)((long)info + 0xd8) & 0xffffff;
    *(uint *)((long)info + 0xd8) = (uint)data << 0x18 | *(uint *)((long)info + 0xd8);
    okim6295_clock_changed((okim6295_state *)info);
    break;
  case '\f':
    okim6295_set_pin7((okim6295_state *)info,data);
    break;
  case '\x0e':
    *(UINT8 *)((long)info + 0xd2) = data;
    break;
  case '\x0f':
    okim6295_set_bank_base((okim6295_state *)info,(uint)data << 0x12);
    break;
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
    *(UINT8 *)((long)info + (long)(int)(offset & 3) + 0xd3) = data;
  }
  return;
}

Assistant:

static void okim6295_w(void* info, UINT8 offset, UINT8 data)
{
	okim6295_state *chip = (okim6295_state *)info;
	
	switch(offset)
	{
	case 0x00:
		okim6295_write_command(chip, data);
		break;
	case 0x08:
		chip->master_clock &= ~0x000000FF;
		chip->master_clock |= data <<  0;
		break;
	case 0x09:
		chip->master_clock &= ~0x0000FF00;
		chip->master_clock |= data <<  8;
		break;
	case 0x0A:
		chip->master_clock &= ~0x00FF0000;
		chip->master_clock |= data << 16;
		break;
	case 0x0B:
		chip->master_clock &= ~0xFF000000;
		chip->master_clock |= data << 24;
		okim6295_clock_changed(chip);
		break;
	case 0x0C:
		okim6295_set_pin7(chip, data);
		break;
	case 0x0E:	// NMK112 bank switch enable
		chip->nmk_mode = data;
		break;
	case 0x0F:
		okim6295_set_bank_base(chip, data << 18);
		break;
	case 0x10:
	case 0x11:
	case 0x12:
	case 0x13:
		chip->nmk_bank[offset & 0x03] = data;
		break;
	}
	
	return;
}